

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O2

shared_ptr<pstack::Dwarf::DIE::Raw> __thiscall
pstack::Dwarf::DIE::decode(DIE *this,Unit *unit,DIE *parent,Off offset)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  shared_ptr<pstack::Dwarf::DIE::Raw> sVar4;
  Off local_80;
  undefined8 local_78;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined4 local_60;
  Off local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  Object *local_40;
  Unit *unit_local;
  size_t abbrev;
  
  local_40 = (Object *)unit;
  Elf::Section::io((Section *)&stack0xffffffffffffffb0);
  local_80 = offset;
  iVar3 = (*local_50->_vptr_Reader[8])();
  peVar2 = local_50;
  local_78 = CONCAT44(extraout_var,iVar3);
  local_70 = local_50;
  local_68._M_pi = _Stack_48._M_pi;
  local_50 = (element_type *)0x0;
  _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60 = 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffb8);
  iVar3 = (*peVar2->_vptr_Reader[3])(peVar2,offset);
  unit_local = (Unit *)CONCAT44(extraout_var_00,iVar3);
  local_80 = extraout_RDX + offset;
  if (unit_local == (Unit *)0x0) {
    peVar1 = (parent->raw).super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 != (element_type *)0x0) {
      peVar1->nextSibling = local_80;
    }
    this->offset = 0;
    (this->raw).super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_58 = parent->offset;
    std::
    make_shared<pstack::Dwarf::DIE::Raw,pstack::Dwarf::Unit*&,pstack::Dwarf::DWARFReader&,unsigned_long&,unsigned_long>
              ((Unit **)this,(DWARFReader *)&stack0xffffffffffffffc0,&local_80,
               (unsigned_long *)&unit_local);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  sVar4.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX_00._M_pi;
  sVar4.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Dwarf::DIE::Raw>)
         sVar4.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DIE::Raw>
DIE::decode(Unit *unit, const DIE &parent, Elf::Off offset)
{
    DWARFReader r(unit->dwarf->debugInfo.io(), offset);
    size_t abbrev = r.getuleb128();
    if (abbrev == 0) {
        // If we get to the terminator, then we now know the parent's nextSibling:
        // update it now.
        if (parent)
            parent.raw->nextSibling = r.getOffset();
        return nullptr;
    }
    return std::make_shared<DIE::Raw>(unit, r, abbrev, parent.getOffset());
}